

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essentials_t *
opengv::relative_pose::fivept_nister
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  Indices *in_RDI;
  Indices idx;
  Indices *in_stack_000005e8;
  RelativeAdapterBase *in_stack_000005f0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffb8);
  fivept_nister(in_stack_000005f0,in_stack_000005e8);
  return (essentials_t *)in_RDI;
}

Assistant:

opengv::essentials_t
opengv::relative_pose::fivept_nister(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return fivept_nister(adapter,idx);
}